

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  stbi_uc *psVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  byte *pbVar28;
  ulong uVar29;
  bool bVar30;
  stbi_uc *local_f0;
  stbi_uc *local_d8;
  byte *local_c8;
  ulong local_78;
  ulong uVar15;
  
  uVar24 = (ulong)x;
  bVar30 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar30;
  a_00 = a->s->img_n;
  lVar26 = (long)a_00;
  uVar7 = a_00 << bVar30;
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar30,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar8 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar8 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar9 = a_00 * x;
      uVar14 = uVar9 * depth + 7 >> 3;
      uVar15 = (ulong)uVar14;
      if (raw_len < (uVar14 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else {
        lVar20 = -(ulong)uVar6;
        lVar21 = (long)(out_n << bVar30);
        lVar22 = -lVar21;
        uVar18 = 0;
        uVar19 = 0;
        local_78 = uVar24;
        while( true ) {
          if (uVar19 == y) {
            if (depth < 8) {
              uVar7 = 0;
              for (uVar19 = 0; uVar19 != y; uVar19 = uVar19 + 1) {
                bVar4 = 1;
                if (color == 0) {
                  bVar4 = ""[depth];
                }
                uVar25 = (ulong)uVar7;
                psVar10 = a->out;
                uVar13 = (ulong)(uVar6 * (int)uVar19);
                if (depth == 4) {
                  lVar26 = (uVar5 - uVar15) + uVar25;
                  lVar20 = 0;
                  for (uVar14 = uVar9; 1 < (int)uVar14; uVar14 = uVar14 - 2) {
                    psVar10[lVar20 * 2 + uVar25] = (psVar10[lVar20 + lVar26] >> 4) * bVar4;
                    psVar10[lVar20 * 2 + uVar25 + 1] = (psVar10[lVar20 + lVar26] & 0xf) * bVar4;
                    lVar20 = lVar20 + 1;
                  }
                  if (uVar14 == 1) {
                    psVar10[lVar20 * 2 + uVar25] = (psVar10[lVar20 + lVar26] >> 4) * bVar4;
                  }
                }
                else {
                  pbVar28 = psVar10 + ((uVar5 + uVar13) - uVar15);
                  if (depth == 2) {
                    psVar10 = psVar10 + uVar25 + 3;
                    for (uVar14 = uVar9; 3 < (int)uVar14; uVar14 = uVar14 - 4) {
                      psVar10[-3] = (*pbVar28 >> 6) * bVar4;
                      psVar10[-2] = (*pbVar28 >> 4 & 3) * bVar4;
                      psVar10[-1] = (*pbVar28 >> 2 & 3) * bVar4;
                      *psVar10 = (*pbVar28 & 3) * bVar4;
                      pbVar28 = pbVar28 + 1;
                      psVar10 = psVar10 + 4;
                    }
                    if (((0 < (int)uVar14) && (psVar10[-3] = (*pbVar28 >> 6) * bVar4, uVar14 != 1))
                       && (psVar10[-2] = (*pbVar28 >> 4 & 3) * bVar4, uVar14 == 3)) {
                      psVar10[-1] = (*pbVar28 >> 2 & 3) * bVar4;
                    }
                  }
                  else if (depth == 1) {
                    pbVar11 = psVar10 + uVar25 + 7;
                    for (uVar14 = uVar9; 7 < (int)uVar14; uVar14 = uVar14 - 8) {
                      pbVar11[-7] = (char)*pbVar28 >> 7 & bVar4;
                      pbVar11[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar4;
                      pbVar11[-5] = (char)(*pbVar28 << 2) >> 7 & bVar4;
                      pbVar11[-4] = (char)(*pbVar28 << 3) >> 7 & bVar4;
                      pbVar11[-3] = (char)(*pbVar28 << 4) >> 7 & bVar4;
                      pbVar11[-2] = (char)(*pbVar28 << 5) >> 7 & bVar4;
                      pbVar11[-1] = (char)(*pbVar28 << 6) >> 7 & bVar4;
                      bVar17 = bVar4;
                      if ((*pbVar28 & 1) == 0) {
                        bVar17 = 0;
                      }
                      *pbVar11 = bVar17;
                      pbVar28 = pbVar28 + 1;
                      pbVar11 = pbVar11 + 8;
                    }
                    if (((((0 < (int)uVar14) &&
                          (pbVar11[-7] = (char)*pbVar28 >> 7 & bVar4, uVar14 != 1)) &&
                         ((pbVar11[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar4, 2 < uVar14 &&
                          ((pbVar11[-5] = (char)(*pbVar28 << 2) >> 7 & bVar4, uVar14 != 3 &&
                           (pbVar11[-4] = (char)(*pbVar28 << 3) >> 7 & bVar4, 4 < uVar14)))))) &&
                        (pbVar11[-3] = (char)(*pbVar28 << 4) >> 7 & bVar4, uVar14 != 5)) &&
                       (pbVar11[-2] = (char)(*pbVar28 << 5) >> 7 & bVar4, uVar14 == 7)) {
                      pbVar11[-1] = (char)(*pbVar28 << 6) >> 7 & bVar4;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar10 = a->out;
                  iVar8 = x - 1;
                  uVar25 = uVar24 * 3;
                  uVar14 = x * 4;
                  if (a_00 == 1) {
                    uVar14 = x * 2 - 1;
                    for (iVar8 = 0; -1 < (int)((x - 1) + iVar8); iVar8 = iVar8 + -1) {
                      psVar10[uVar14 + uVar13] = 0xff;
                      psVar10[(uVar14 - 1) + uVar13] =
                           psVar10[((x - 1) + iVar8 & 0x7fffffff) + uVar13];
                      uVar14 = uVar14 - 2;
                    }
                  }
                  else {
                    while( true ) {
                      uVar25 = uVar25 - 3;
                      if (iVar8 < 0) break;
                      psVar10[(uVar14 - 1) + uVar13] = 0xff;
                      uVar29 = uVar25 & 0xffffffff;
                      psVar10[(uVar14 - 2) + uVar13] = psVar10[uVar29 + uVar13 + 2];
                      psVar10[(uVar14 - 3) + uVar13] = psVar10[uVar29 + uVar13 + 1];
                      psVar10[(uVar14 - 4) + uVar13] = psVar10[uVar29 + uVar13];
                      iVar8 = iVar8 + -1;
                      uVar14 = uVar14 - 4;
                    }
                  }
                }
                uVar7 = uVar7 + uVar6;
              }
              return 1;
            }
            if (depth == 0x10) {
              psVar10 = a->out;
              for (lVar26 = 0; uVar5 * y != (int)lVar26; lVar26 = lVar26 + 1) {
                puVar1 = (ushort *)(psVar10 + lVar26 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            return 1;
          }
          uVar13 = (ulong)*raw;
          if (4 < uVar13) break;
          local_f0 = a->out + uVar6 * (int)uVar19;
          if (depth < 8) {
            if (x < uVar14) {
              stbi__g_failure_reason = "invalid width";
              return 0;
            }
            local_f0 = local_f0 + (uVar5 - uVar14);
            uVar7 = 1;
            local_78 = uVar15;
          }
          if (uVar19 == 0) {
            uVar13 = (ulong)""[uVar13];
          }
          uVar25 = 0;
          if (0 < (int)uVar7) {
            uVar25 = (ulong)uVar7;
          }
          for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
            switch(uVar13) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar29 + 1];
              break;
            case 2:
              bVar4 = local_f0[uVar29 + lVar20];
              goto LAB_0014ebb9;
            case 3:
              bVar4 = local_f0[uVar29 + lVar20] >> 1;
LAB_0014ebb9:
              bVar4 = bVar4 + raw[uVar29 + 1];
              break;
            case 4:
              bVar4 = raw[uVar29 + 1];
              iVar8 = stbi__paeth(0,(uint)local_f0[uVar29 + lVar20],0);
              bVar4 = (char)iVar8 + bVar4;
              break;
            default:
              goto switchD_0014eb73_default;
            }
            local_f0[uVar29] = bVar4;
switchD_0014eb73_default:
          }
          lVar27 = (long)(int)uVar7;
          if (depth == 8) {
            lVar12 = (long)out_n;
            lVar2 = lVar26;
            if (a_00 != out_n) {
              local_f0[lVar26] = 0xff;
            }
LAB_0014ec25:
            local_c8 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar12 = lVar21;
              lVar2 = lVar27;
              if (a_00 != out_n) {
                local_f0[lVar27] = 0xff;
                local_f0[lVar27 + 1] = 0xff;
              }
              goto LAB_0014ec25;
            }
            local_c8 = raw + 2;
            lVar12 = 1;
          }
          psVar10 = local_f0 + lVar12;
          local_d8 = local_f0 + lVar12 + lVar20;
          if (a_00 == out_n || depth < 8) {
            uVar16 = ((int)local_78 + -1) * uVar7;
            switch(uVar13) {
            case 0:
              memcpy(psVar10,local_c8,(long)(int)uVar16);
              break;
            case 1:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
                psVar10[uVar13] = psVar10[uVar13 - lVar27] + local_c8[uVar13];
              }
              break;
            case 2:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
                psVar10[uVar13] = psVar10[uVar13 + lVar20] + local_c8[uVar13];
              }
              break;
            case 3:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              uVar13 = (ulong)uVar3;
              pbVar28 = local_c8;
              while (bVar30 = uVar13 != 0, uVar13 = uVar13 - 1, bVar30) {
                *psVar10 = (char)((uint)psVar10[-lVar27] + (uint)psVar10[lVar20] >> 1) + *pbVar28;
                psVar10 = psVar10 + 1;
                pbVar28 = pbVar28 + 1;
              }
              break;
            case 4:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
                bVar4 = local_c8[uVar13];
                iVar8 = stbi__paeth((uint)psVar10[uVar13 - lVar27],(uint)local_d8[uVar13],
                                    (uint)local_d8[uVar13 - lVar27]);
                psVar10[uVar13] = (char)iVar8 + bVar4;
              }
              break;
            case 5:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
                psVar10[uVar13] = (psVar10[uVar13 - lVar27] >> 1) + local_c8[uVar13];
              }
              break;
            case 6:
              uVar3 = uVar16;
              if ((int)uVar16 < 1) {
                uVar3 = 0;
              }
              for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
                psVar10[uVar13] = psVar10[uVar13 - lVar27] + local_c8[uVar13];
              }
            }
            local_c8 = local_c8 + (int)uVar16;
          }
          else {
            switch(uVar13) {
            case 0:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, uVar16 != 0) {
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  psVar10[uVar29] = local_c8[uVar29];
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
              break;
            case 1:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, uVar16 != 0) {
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  psVar10[uVar29] = psVar10[uVar29 + lVar22] + local_c8[uVar29];
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
              break;
            case 2:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, uVar16 != 0) {
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  psVar10[uVar29] = psVar10[uVar29 + lVar20] + local_c8[uVar29];
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
              break;
            case 3:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, pbVar28 = local_c8,
                    psVar23 = psVar10, uVar29 = uVar25, uVar16 != 0) {
                while (uVar29 != 0) {
                  *psVar23 = (char)((uint)psVar23[lVar22] + (uint)psVar23[lVar20] >> 1) + *pbVar28;
                  pbVar28 = pbVar28 + 1;
                  psVar23 = psVar23 + 1;
                  uVar29 = uVar29 - 1;
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
              break;
            case 4:
              psVar23 = local_f0 + lVar12 + lVar22;
              local_f0 = local_f0 + lVar12 + (lVar22 - (ulong)uVar6);
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar16 != 0) {
                for (uVar13 = 0; uVar25 != uVar13; uVar13 = uVar13 + 1) {
                  bVar4 = local_c8[uVar13];
                  iVar8 = stbi__paeth((uint)psVar23[uVar13],(uint)local_d8[uVar13],
                                      (uint)local_f0[uVar13]);
                  psVar10[uVar13] = (char)iVar8 + bVar4;
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
                local_d8 = local_d8 + lVar21;
                psVar23 = psVar23 + lVar21;
                local_f0 = local_f0 + lVar21;
                uVar13 = (ulong)uVar16;
              }
              break;
            case 5:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, uVar16 != 0) {
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  psVar10[uVar29] = (psVar10[uVar29 + lVar22] >> 1) + local_c8[uVar29];
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
              break;
            case 6:
              uVar13 = uVar24;
              while (uVar16 = (int)uVar13 - 1, uVar13 = (ulong)uVar16, uVar16 != 0) {
                for (uVar29 = 0; uVar25 != uVar29; uVar29 = uVar29 + 1) {
                  psVar10[uVar29] = psVar10[uVar29 + lVar22] + local_c8[uVar29];
                }
                psVar10[lVar27] = 0xff;
                local_c8 = local_c8 + lVar27;
                psVar10 = psVar10 + lVar21;
              }
            }
            if (depth == 0x10) {
              psVar10 = a->out + (long)(int)(uVar7 + 1) + (ulong)uVar18;
              uVar13 = uVar24;
              while (iVar8 = (int)uVar13, uVar13 = (ulong)(iVar8 - 1), iVar8 != 0) {
                *psVar10 = 0xff;
                psVar10 = psVar10 + lVar21;
              }
            }
          }
          uVar19 = uVar19 + 1;
          uVar18 = uVar18 + uVar6;
          raw = local_c8;
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }